

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall Population::update(Population *this)

{
  Logging *this_00;
  int iVar1;
  reference ppNVar2;
  undefined4 extraout_var;
  reference ppEVar3;
  long in_RDI;
  double dVar4;
  double dVar5;
  int i;
  Population *in_stack_ffffffffffffffd0;
  int local_c;
  
  while( true ) {
    dVar5 = *(double *)(in_RDI + 0x48);
    dVar4 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x50));
    if (dVar4 <= dVar5) break;
    resetOutput(in_stack_ffffffffffffffd0);
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x28); local_c = local_c + 1) {
      ppNVar2 = std::vector<Neuron_*,_std::allocator<Neuron_*>_>::operator[]
                          ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)(in_RDI + 0x30),
                           (long)local_c);
      in_stack_ffffffffffffffd0 = (Population *)*ppNVar2;
      Clock::getDt(*(Clock **)(in_RDI + 0x50));
      iVar1 = (**in_stack_ffffffffffffffd0->_vptr_Population)();
      ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 8),(long)local_c);
      *ppEVar3 = (value_type)CONCAT44(extraout_var,iVar1);
      ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 8),(long)local_c);
      if ((*ppEVar3)->type != No) {
        this_00 = *(Logging **)(in_RDI + 0x58);
        ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 8),(long)local_c
                            );
        Logging::logEvent(this_00,in_RDI,local_c,(*ppEVar3)->type);
      }
      ppNVar2 = std::vector<Neuron_*,_std::allocator<Neuron_*>_>::operator[]
                          ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)(in_RDI + 0x30),
                           (long)local_c);
      (**(code **)(*(long *)*ppNVar2 + 0x10))();
    }
    dVar5 = Clock::getDt(*(Clock **)(in_RDI + 0x50));
    *(double *)(in_RDI + 0x48) = dVar5 + *(double *)(in_RDI + 0x48);
  }
  return;
}

Assistant:

virtual void update() {
        while(current_time < clock->getCurrentTime()) {
            resetOutput();
            for(int i = 0; i < numberOfOutputNeurons; i++) {
                output[i] = neurons[i]->update(clock->getDt());
                if(output[i]->type != EventType::No) {
                    logger->logEvent((long)this, i, output[i]->type);
                }
                neurons[i]->resetInput();
            }
            current_time += clock->getDt();
        }
    }